

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::StringOutputTask::~StringOutputTask(StringOutputTask *this)

{
  StringOutputTask *this_local;
  
  ~StringOutputTask(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

explicit StringOutputTask(const std::string& name) : SystemTaskBase(name) {
        hasOutputArgs = true;
    }